

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

void __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::save
          (segment_impl<ELFIO::Elf64_Phdr> *this,ostream *stream,streampos header_offset,
          streampos data_offset)

{
  Elf64_Off EVar1;
  uint64_t uVar2;
  streamoff offset;
  ostream *stream_local;
  segment_impl<ELFIO::Elf64_Phdr> *this_local;
  streampos data_offset_local;
  streampos header_offset_local;
  
  data_offset_local._M_off = (streamoff)data_offset._M_state;
  this_local = (segment_impl<ELFIO::Elf64_Phdr> *)data_offset._M_off;
  data_offset_local._M_state = (__mbstate_t)header_offset._M_off;
  EVar1 = std::fpos::operator_cast_to_long((fpos *)&this_local);
  (this->ph).p_offset = EVar1;
  uVar2 = endianness_convertor::operator()(this->convertor,(this->ph).p_offset);
  (this->ph).p_offset = uVar2;
  offset = std::fpos::operator_cast_to_long((fpos *)&data_offset_local._M_state);
  adjust_stream_size(stream,offset);
  std::ostream::write((char *)stream,(long)&this->ph);
  return;
}

Assistant:

void save( std::ostream&  stream,
               std::streampos header_offset,
               std::streampos data_offset ) override
    {
        ph.p_offset = decltype( ph.p_offset )( data_offset );
        ph.p_offset = ( *convertor )( ph.p_offset );
        adjust_stream_size( stream, header_offset );
        stream.write( reinterpret_cast<const char*>( &ph ), sizeof( ph ) );
    }